

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O2

void CT_Drawer(void)

{
  byte *pbVar1;
  FFont *pFVar2;
  DFrameBuffer *pDVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  AActor *pAVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 uVar18;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar19;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uVar20;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar21;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar22;
  undefined8 in_stack_ffffffffffffffa8;
  ulong local_48;
  
  if (chatmodeon != 0) {
    iVar9 = -0x1e;
    if (gamestate != GS_LEVEL) {
      iVar9 = -10;
    }
    if (viewactive) {
      iVar9 = -10;
    }
    iVar4 = active_con_scaletext();
    iVar14 = CleanYfac;
    iVar17 = CleanXfac;
    if (iVar4 != 0) {
      iVar14 = 1;
      iVar17 = 1;
    }
    iVar4 = active_con_scaletext();
    uVar11 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    uVar13 = (ulong)uVar11;
    if (iVar4 == 0) {
      uVar11 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      local_48 = (ulong)uVar11;
      iVar4 = ST_Y;
    }
    else {
      iVar5 = active_con_scaletext();
      iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      uVar13 = (long)(int)uVar11 / (long)iVar5 & 0xffffffff;
      iVar6 = active_con_scaletext();
      iVar5 = ST_Y;
      local_48 = (long)iVar4 / (long)iVar6 & 0xffffffff;
      iVar4 = active_con_scaletext();
      uVar11 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      iVar4 = iVar5 / iVar4;
    }
    iVar6 = (int)local_48;
    iVar5 = iVar6;
    if (((uVar11 != viewheight) || (viewactive == false)) && (gamestate == GS_LEVEL)) {
      iVar5 = iVar4;
    }
    iVar4 = FFont::StringWidth(SmallFont,(BYTE *)"Say: ");
    iVar4 = iVar4 * iVar17;
    iVar7 = (*SmallFont->_vptr_FFont[3])(SmallFont,0x5f);
    iVar7 = iVar4 + iVar7 * iVar17 * 2;
    uVar16 = (ulong)(uint)len;
    while( true ) {
      uVar18 = (undefined4)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      uVar19 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      uVar11 = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      uVar22 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      uVar21 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      uVar20 = (undefined4)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      if (((int)uVar16 < 1) || ((int)uVar13 <= iVar7)) break;
      pbVar1 = &DAT_009a8aff + uVar16;
      uVar16 = uVar16 - 1;
      iVar8 = (*SmallFont->_vptr_FFont[3])(SmallFont,(ulong)(*pbVar1 & 0x7f));
      iVar7 = iVar7 + iVar8 * iVar17;
    }
    iVar5 = iVar5 + iVar14 * iVar9;
    uVar15 = 0;
    if (0 < (int)uVar16) {
      uVar15 = uVar16 & 0xffffffff;
    }
    lVar12 = (long)len;
    ChatQueue[lVar12] = SmallFont->Cursor;
    ChatQueue[lVar12 + 1] = '\0';
    iVar9 = active_con_scaletext();
    pDVar3 = screen;
    pFVar2 = SmallFont;
    if (iVar9 < 2) {
      iVar9 = active_con_scaletext();
      DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,3,0,iVar5,"Say: ",0x40001393,
                        CONCAT44(uVar22,(uint)(iVar9 == 0)),(ulong)uVar11 << 0x20);
      pDVar3 = screen;
      pFVar2 = SmallFont;
      iVar9 = active_con_scaletext();
      DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,2,iVar4,iVar5,(char *)(ChatQueue + uVar15),
                        0x40001393,(ulong)(iVar9 == 0),0);
    }
    else {
      DCanvas::DrawText((DCanvas *)screen,SmallFont,3,0,iVar5,"Say: ",0x40001399,
                        CONCAT44(uVar18,(int)uVar13),CONCAT44(uVar19,0x4000139a),
                        CONCAT44(uVar20,iVar6),CONCAT44(uVar21,0x400013a8),CONCAT44(uVar22,1),
                        (ulong)uVar11 << 0x20);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,2,iVar4,iVar5,(char *)(ChatQueue + uVar15),
                        0x40001399,uVar13,0x4000139a,local_48,0x400013a8,1,0);
    }
    ChatQueue[len] = '\0';
    BorderTopRefresh =
         (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
  }
  pAVar10 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
  if (((pAVar10 != (AActor *)0x0) &&
      (((Button_ShowScores.bDown != '\0' ||
        (pAVar10 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54)),
        pAVar10->health < 1)) || (SB_ForceActive == true)))) && (gamestate != GS_INTERMISSION)) {
    HU_DrawScores((player_t *)(&players + (long)consoleplayer * 0x54));
    return;
  }
  return;
}

Assistant:

void CT_Drawer (void)
{
	if (chatmodeon)
	{
		static const char *prompt = "Say: ";
		int i, x, scalex, y, promptwidth;

		y = (viewactive || gamestate != GS_LEVEL) ? -10 : -30;
		if (active_con_scaletext() == 0)
		{
			scalex = CleanXfac;
			y *= CleanYfac;
		}
		else
		{
			scalex = 1;
		}

		int screen_width, screen_height, st_y;
		if (active_con_scaletext() == 0)
		{
			screen_width = SCREENWIDTH;
			screen_height = SCREENHEIGHT;
			st_y = ST_Y;
		}
		else
		{
			screen_width = SCREENWIDTH / active_con_scaletext();
			screen_height = SCREENHEIGHT / active_con_scaletext();
			st_y = ST_Y / active_con_scaletext();
		}

		y += ((SCREENHEIGHT == viewheight && viewactive) || gamestate != GS_LEVEL) ? screen_height : st_y;

		promptwidth = SmallFont->StringWidth (prompt) * scalex;
		x = SmallFont->GetCharWidth ('_') * scalex * 2 + promptwidth;

		// figure out if the text is wider than the screen->
		// if so, only draw the right-most portion of it.
		for (i = len - 1; i >= 0 && x < screen_width; i--)
		{
			x += SmallFont->GetCharWidth (ChatQueue[i] & 0x7f) * scalex;
		}

		if (i >= 0)
		{
			i++;
		}
		else
		{
			i = 0;
		}

		// draw the prompt, text, and cursor
		ChatQueue[len] = SmallFont->GetCursor();
		ChatQueue[len+1] = '\0';
		if (active_con_scaletext() < 2)
		{
			screen->DrawText (SmallFont, CR_GREEN, 0, y, prompt, DTA_CleanNoMove, active_con_scaletext() == 0, TAG_DONE);
			screen->DrawText (SmallFont, CR_GREY, promptwidth, y, (char *)(ChatQueue + i), DTA_CleanNoMove, active_con_scaletext() == 0, TAG_DONE);
		}
		else
		{
			screen->DrawText (SmallFont, CR_GREEN, 0, y, prompt, 
				DTA_VirtualWidth, screen_width, DTA_VirtualHeight, screen_height, DTA_KeepRatio, true, TAG_DONE);
			screen->DrawText (SmallFont, CR_GREY, promptwidth, y, (char *)(ChatQueue + i), 
				DTA_VirtualWidth, screen_width, DTA_VirtualHeight, screen_height, DTA_KeepRatio, true, TAG_DONE);
		}
		ChatQueue[len] = '\0';

		BorderTopRefresh = screen->GetPageCount ();
	}

	if (players[consoleplayer].camera != NULL &&
		(Button_ShowScores.bDown ||
		 players[consoleplayer].camera->health <= 0 ||
		 SB_ForceActive) &&
		 // Don't draw during intermission, since it has its own scoreboard in wi_stuff.cpp.
		 gamestate != GS_INTERMISSION)
	{
		HU_DrawScores (&players[consoleplayer]);
	}
}